

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Tree_Item_Array.cxx
# Opt level: O1

int __thiscall Fl_Tree_Item_Array::move(Fl_Tree_Item_Array *this,int to,int from)

{
  Fl_Tree_Item *pFVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  iVar3 = 0;
  if ((((from != to) && (iVar3 = -1, -1 < to)) && (from < this->_total)) &&
     ((-1 < from && (to < this->_total)))) {
    uVar2 = (ulong)(uint)from;
    pFVar1 = this->_items[uVar2];
    bVar6 = SBORROW4(from,to);
    iVar3 = from - to;
    bVar5 = from == to;
    if (from < to) {
      if (from <= this->_total) {
        do {
          this->_items[uVar2] = this->_items[uVar2 + 1];
          if (to <= from + 1) break;
          bVar5 = from < this->_total;
          uVar2 = uVar2 + 1;
          from = from + 1;
        } while (bVar5);
      }
    }
    else {
      while (!bVar5 && bVar6 == iVar3 < 0) {
        this->_items[(uint)from] = this->_items[(ulong)(uint)from - 1];
        from = from - 1;
        bVar6 = SBORROW4(from,to);
        iVar3 = from - to;
        bVar5 = from == to;
      }
    }
    this->_items[(uint)to] = pFVar1;
    iVar3 = 0;
    if (0 < this->_total) {
      iVar3 = 0;
      lVar4 = 0;
      do {
        Fl_Tree_Item::update_prev_next(this->_items[lVar4],(int)lVar4);
        lVar4 = lVar4 + 1;
      } while (lVar4 < this->_total);
    }
  }
  return iVar3;
}

Assistant:

int Fl_Tree_Item_Array::move(int to, int from) {
  if ( from == to ) return 0;    // nop
  if ( to<0 || to>=_total || from<0 || from>=_total ) return -1;
  Fl_Tree_Item *item = _items[from];
  // Remove item..
  if ( from < to )
    for ( int t=from; t<to && t<(_total+1); t++ )
      _items[t] = _items[t+1];
  else
    for ( int t=from; t>to && t>0; t-- )
      _items[t] = _items[t-1];
  // Move to new position
  _items[to] = item;
  // Update all children
  for ( int r=0; r<_total; r++ )	// XXX: excessive to do all children,
    _items[r]->update_prev_next(r);	// XXX: but avoids weird boundary issues
  return 0;
}